

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void memory_region_transaction_commit_arm(MemoryRegion *mr)

{
  uc_struct_conflict1 *uc;
  uc_struct_conflict7 *puVar1;
  MemoryRegion *mr_00;
  gpointer pvVar2;
  MemoryListener *pMVar3;
  AddressSpace *pAVar4;
  
  uc = (uc_struct_conflict1 *)mr->uc;
  if (uc->memory_region_update_pending == true) {
    if (uc->flat_views != (GHashTable *)0x0) {
      g_hash_table_destroy(uc->flat_views);
      uc->flat_views = (GHashTable *)0x0;
    }
    flatviews_init(uc);
    for (pAVar4 = (uc->address_spaces).tqh_first; pAVar4 != (AddressSpace *)0x0;
        pAVar4 = (pAVar4->address_spaces_link).tqe_next) {
      mr_00 = memory_region_get_flatview_root((MemoryRegion *)pAVar4->root);
      pvVar2 = g_hash_table_lookup(uc->flat_views,mr_00);
      if (pvVar2 == (gpointer)0x0) {
        generate_memory_topology(uc,mr_00);
      }
    }
    for (pMVar3 = (mr->uc->memory_listeners).tqh_first; pMVar3 != (MemoryListener *)0x0;
        pMVar3 = (pMVar3->link).tqe_next) {
      if (pMVar3->begin != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar3->begin)(pMVar3);
      }
    }
    for (pAVar4 = (mr->uc->address_spaces).tqh_first; pAVar4 != (AddressSpace *)0x0;
        pAVar4 = (pAVar4->address_spaces_link).tqe_next) {
      address_space_set_flatview(pAVar4);
    }
    puVar1 = mr->uc;
    puVar1->memory_region_update_pending = false;
    for (pMVar3 = (puVar1->memory_listeners).tqh_first; pMVar3 != (MemoryListener *)0x0;
        pMVar3 = (pMVar3->link).tqe_next) {
      if (pMVar3->commit != (_func_void_MemoryListener_ptr *)0x0) {
        (*pMVar3->commit)(pMVar3);
      }
    }
  }
  return;
}

Assistant:

void memory_region_transaction_commit(MemoryRegion *mr)
{
    AddressSpace *as;

    if (mr->uc->memory_region_update_pending) {
        flatviews_reset(mr->uc);

        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, begin, Forward);

        QTAILQ_FOREACH(as, &mr->uc->address_spaces, address_spaces_link) {
            address_space_set_flatview(as);
        }
        mr->uc->memory_region_update_pending = false;
        MEMORY_LISTENER_CALL_GLOBAL(mr->uc, commit, Forward);
    }
}